

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# activity_tracking.hpp
# Opt level: O0

activity_stats_t * __thiscall
so_5::stats::activity_tracking_stuff::
stats_collector_t<so_5::stats::activity_tracking_stuff::null_lock>::take_stats
          (activity_stats_t *__return_storage_ptr__,
          stats_collector_t<so_5::stats::activity_tracking_stuff::null_lock> *this)

{
  null_lock *pnVar1;
  activity_stats_t *result;
  no_actual_lock<so_5::stats::activity_tracking_stuff::null_lock> local_21;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  tStack_20;
  take_stats_lock_t lock;
  time_point work_started_at;
  bool is_in_working;
  stats_collector_t<so_5::stats::activity_tracking_stuff::null_lock> *this_local;
  
  activity_stats_t::activity_stats_t(__return_storage_ptr__);
  std::chrono::
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point(&stack0xffffffffffffffe0);
  pnVar1 = lock_holder(this);
  no_actual_lock<so_5::stats::activity_tracking_stuff::null_lock>::no_actual_lock(&local_21,pnVar1);
  __return_storage_ptr__->m_count = (this->m_work_activity).m_count;
  (__return_storage_ptr__->m_total_time).__r = (this->m_work_activity).m_total_time.__r;
  (__return_storage_ptr__->m_avg_time).__r = (this->m_work_activity).m_avg_time.__r;
  if ((this->m_is_in_working & 1U) == 1) {
    tStack_20.__d.__r = (duration)(this->m_work_started_at).__d.__r;
  }
  if ((this->m_is_in_working & 1U) != 0) {
    details::update_stats_from_current_time(__return_storage_ptr__,(time_point)tStack_20.__d.__r);
  }
  return __return_storage_ptr__;
}

Assistant:

so_5::stats::activity_stats_t
		take_stats()
			{
				so_5::stats::activity_stats_t result;
				bool is_in_working{ false };
				so_5::stats::clock_type_t::time_point work_started_at;

				{
					typename LOCK_HOLDER::take_stats_lock_t lock{ lock_holder() };

					result = m_work_activity;
					if( true == (is_in_working = m_is_in_working) )
						work_started_at = m_work_started_at;
				}

				if( is_in_working )
					so_5::stats::details::update_stats_from_current_time(
							result,
							work_started_at );

				return result;
			}